

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vm.hpp
# Opt level: O1

void __thiscall squall::VM::VM(VM *this,int stack_size)

{
  TableBase *pTVar1;
  HSQUIRRELVM v;
  TableBase *this_00;
  
  v = sq_open((long)stack_size);
  (this->imp_).vm_ = v;
  (this->klass_table_).klasses_._M_h._M_buckets =
       &(this->klass_table_).klasses_._M_h._M_single_bucket;
  (this->klass_table_).klasses_._M_h._M_bucket_count = 1;
  (this->klass_table_).klasses_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->klass_table_).klasses_._M_h._M_element_count = 0;
  (this->klass_table_).klasses_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->klass_table_).klasses_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->klass_table_).klasses_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->root_table_)._M_t.
  super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
  super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
  super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl = (TableBase *)0x0;
  sq_setforeignptr(v,&this->klass_table_);
  sq_pushroottable(v);
  sq_getstackobj(v,-1,&this->root_);
  sq_pop(v,-1);
  this_00 = (TableBase *)operator_new(0x20);
  TableBase::TableBase(this_00,v,&this->root_);
  pTVar1 = (this->root_table_)._M_t.
           super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
           super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
           super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl;
  (this->root_table_)._M_t.
  super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
  super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
  super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl = this_00;
  if (pTVar1 != (TableBase *)0x0) {
    (*pTVar1->_vptr_TableBase[1])();
    return;
  }
  return;
}

Assistant:

VM(int stack_size = 1024) : imp_(stack_size) {
        HSQUIRRELVM vm = handle();
        sq_setforeignptr(vm, &klass_table_);

        // root table取得 
        sq_pushroottable(vm);
        sq_getstackobj(vm, -1, &root_);
        sq_pop(vm, -1);

        root_table_.reset(new TableBase(vm, root_));
    }